

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphListAdd(Nwk_Grf_t *p,int *pList,Nwk_Vrt_t *pVertex)

{
  int iVar1;
  Nwk_Vrt_t *pNVar2;
  
  iVar1 = pVertex->Id;
  if ((long)*pList != 0) {
    pNVar2 = p->pVerts[*pList];
    pVertex->iPrev = 0;
    pVertex->iNext = pNVar2->Id;
    pNVar2->iPrev = iVar1;
  }
  *pList = iVar1;
  return;
}

Assistant:

static inline void Nwk_ManGraphListAdd( Nwk_Grf_t * p, int * pList, Nwk_Vrt_t * pVertex )
{
    if ( *pList )
    {
        Nwk_Vrt_t * pHead;
        pHead = p->pVerts[*pList];
        pVertex->iPrev = 0;
        pVertex->iNext = pHead->Id;
        pHead->iPrev = pVertex->Id;
    }
    *pList = pVertex->Id;
}